

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

bool __thiscall mp::internal::SolverAppOptionParser::ShowUsage(SolverAppOptionParser *this)

{
  bool bVar1;
  BasicSolver *this_00;
  iterator args_1;
  char **in_RDI;
  iterator end;
  iterator i;
  OptionList *in_stack_ffffffffffffff98;
  __normal_iterator<const_mp::Option_*,_std::vector<mp::Option,_std::allocator<mp::Option>_>_>
  *in_stack_ffffffffffffffa0;
  BasicCStringRef<char> in_stack_ffffffffffffffc8;
  CStringRef in_stack_ffffffffffffffd0;
  BasicCStringRef<char> in_stack_ffffffffffffffe0;
  BasicCStringRef<char> in_stack_fffffffffffffff0;
  
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)&stack0xfffffffffffffff0,
             "usage: {} [options] stub [-AMPL] [<assignment> ...]\n");
  this_00 = (BasicSolver *)BasicSolver::name((BasicSolver *)0x2bad5b);
  BasicSolver::Print<char_const*>
            ((BasicSolver *)in_stack_ffffffffffffffc8.data_,in_stack_ffffffffffffffd0,in_RDI);
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)&stack0xffffffffffffffe0,"\nOptions:\n");
  BasicSolver::Print<>((BasicSolver *)in_stack_ffffffffffffffc8.data_,in_stack_ffffffffffffffd0);
  args_1 = OptionList::begin(in_stack_ffffffffffffff98);
  OptionList::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffa0,
                       (__normal_iterator<const_mp::Option_*,_std::vector<mp::Option,_std::allocator<mp::Option>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    in_stack_ffffffffffffffa0 =
         (__normal_iterator<const_mp::Option_*,_std::vector<mp::Option,_std::allocator<mp::Option>_>_>
          *)in_RDI[4];
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffc8,"\t-{}  {}\n");
    __gnu_cxx::
    __normal_iterator<const_mp::Option_*,_std::vector<mp::Option,_std::allocator<mp::Option>_>_>::
    operator->((__normal_iterator<const_mp::Option_*,_std::vector<mp::Option,_std::allocator<mp::Option>_>_>
                *)&stack0xffffffffffffffd8);
    __gnu_cxx::
    __normal_iterator<const_mp::Option_*,_std::vector<mp::Option,_std::allocator<mp::Option>_>_>::
    operator->((__normal_iterator<const_mp::Option_*,_std::vector<mp::Option,_std::allocator<mp::Option>_>_>
                *)&stack0xffffffffffffffd8);
    BasicSolver::Print<char,char_const*>
              (this_00,(CStringRef)in_stack_fffffffffffffff0.data_,in_stack_ffffffffffffffe0.data_,
               (char **)args_1._M_current);
    __gnu_cxx::
    __normal_iterator<const_mp::Option_*,_std::vector<mp::Option,_std::allocator<mp::Option>_>_>::
    operator++((__normal_iterator<const_mp::Option_*,_std::vector<mp::Option,_std::allocator<mp::Option>_>_>
                *)&stack0xffffffffffffffd8);
  }
  return false;
}

Assistant:

bool SolverAppOptionParser::ShowUsage() {
  solver_.Print("usage: {} [options] stub [-AMPL] [<assignment> ...]\n",
                solver_.name());
  solver_.Print("\nOptions:\n");
  for (OptionList::iterator
       i = options_.begin(), end = options_.end(); i != end; ++i) {
    solver_.Print("\t-{}  {}\n", i->name, i->description);
  }
  return false;
}